

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O3

void __thiscall
BufferInputSource::BufferInputSource(BufferInputSource *this,string *description,string *contents)

{
  pointer pcVar1;
  Buffer *this_00;
  size_t i;
  uchar *__dest;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__BufferInputSource_002efb78;
  this->own_memory = true;
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + description->_M_string_length);
  this_00 = (Buffer *)operator_new(8);
  Buffer::Buffer(this_00,contents->_M_string_length);
  this->buf = this_00;
  this->cur_offset = 0;
  i = Buffer::getSize(this_00);
  if ((long)i < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
  }
  this->max_offset = i;
  __dest = Buffer::getBuffer(this->buf);
  memcpy(__dest,(contents->_M_dataplus)._M_p,contents->_M_string_length);
  return;
}

Assistant:

BufferInputSource::BufferInputSource(std::string const& description, std::string const& contents) :
    own_memory(true),
    description(description),
    buf(new Buffer(contents.length())),
    cur_offset(0),
    max_offset(QIntC::to_offset(buf->getSize()))
{
    memcpy(buf->getBuffer(), contents.c_str(), contents.length());
}